

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteString.cpp
# Opt level: O2

void __thiscall ByteString::ByteString(ByteString *this,char *hexString)

{
  ulong uVar1;
  ulong uVar2;
  string byteStr;
  string hex;
  
  this->_vptr_ByteString = (_func_int **)&PTR__ByteString_0019e890;
  (this->byteString).super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->byteString).super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->byteString).super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->byteString).super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>._M_impl.
  super__Tp_alloc_type._vptr_SecureAllocator = (_func_int **)&PTR__SecureAllocator_0019e8c8;
  std::__cxx11::string::string((string *)&hex,hexString,(allocator *)&byteStr);
  if (((byte)hex._M_string_length & 1) != 0) {
    std::operator+(&byteStr,"0",&hex);
    std::__cxx11::string::operator=((string *)&hex,(string *)&byteStr);
    std::__cxx11::string::~string((string *)&byteStr);
  }
  for (uVar2 = 0; uVar2 < CONCAT71(hex._M_string_length._1_7_,(byte)hex._M_string_length);
      uVar2 = uVar2 + 2) {
    byteStr._M_string_length = 0;
    byteStr.field_2._M_local_buf[0] = '\0';
    byteStr._M_dataplus._M_p = (pointer)&byteStr.field_2;
    std::__cxx11::string::push_back((char)&byteStr);
    std::__cxx11::string::push_back((char)&byteStr);
    uVar1 = strtoul(byteStr._M_dataplus._M_p,(char **)0x0,0x10);
    operator+=(this,(uchar)uVar1);
    std::__cxx11::string::~string((string *)&byteStr);
  }
  std::__cxx11::string::~string((string *)&hex);
  return;
}

Assistant:

ByteString::ByteString(const char* hexString)
{
	std::string hex = std::string(hexString);

	if (hex.size() % 2 != 0)
	{
		hex = "0" + hex;
	}

	for (size_t i = 0; i < hex.size(); i += 2)
	{
		std::string byteStr;
		byteStr += hex[i];
		byteStr += hex[i+1];

		unsigned char byteVal = (unsigned char) strtoul(byteStr.c_str(), NULL, 16);

		this->operator+=(byteVal);
	}
}